

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

void * __thiscall
google::protobuf::internal::ThreadSafeArena::AllocateAlignedWithCleanup
          (ThreadSafeArena *this,size_t n,size_t align,_func_void_void_ptr *destructor)

{
  CleanupNode *pCVar1;
  ArenaBlock *pAVar2;
  bool bVar3;
  char *ptr;
  char **ppcVar4;
  char **v2;
  LogMessage *pLVar5;
  ArenaBlock *pAVar6;
  SerialArena *local_2c0;
  SerialArena *arena;
  _func_void_void_ptr *destructor_local;
  size_t align_local;
  size_t n_local;
  ThreadSafeArena *this_local;
  undefined1 local_280 [16];
  LogMessageFatal local_270 [23];
  Voidify local_259;
  char *local_258;
  string *local_250;
  string *absl_log_internal_check_op_result;
  char *next;
  ThreadSafeArena *local_238;
  char *ret;
  _func_void_void_ptr *local_228;
  ulong local_220;
  SerialArena *local_218;
  ThreadSafeArena *local_210;
  char *local_208;
  ThreadSafeArena *local_200;
  SerialArena *local_1f8;
  byte local_1d9;
  basic_string_view<char,_std::char_traits<char>_> local_1d8;
  LogMessageFatal local_1c8 [23];
  Voidify local_1b1;
  string *local_1b0;
  SerialArena *local_1a8;
  char *local_1a0 [2];
  char *end_1;
  byte local_179;
  basic_string_view<char,_std::char_traits<char>_> local_178;
  LogMessageFatal local_168 [23];
  Voidify local_151;
  char *local_150;
  char *local_148;
  string *local_140;
  long local_138;
  char *local_130;
  size_t local_120;
  SerialArena *local_118;
  char *local_110;
  ThreadSafeArena *local_108;
  ChunkList *local_100;
  ThreadSafeArena *local_f8;
  char *local_f0;
  char *local_e8;
  ThreadSafeArena *local_e0;
  ChunkList *local_d8;
  byte local_b9;
  basic_string_view<char,_std::char_traits<char>_> local_b8;
  LogMessageFatal local_a8 [23];
  Voidify local_91;
  SerialArena *local_90;
  char *local_88;
  CleanupNode *local_80;
  char *end;
  byte local_61;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  LogMessageFatal local_50 [23];
  Voidify local_39;
  CleanupNode *local_38;
  CleanupNode *local_30;
  CleanupNode *local_28;
  long local_20;
  CleanupNode *local_18;
  CleanupNode *local_10;
  
  arena = (SerialArena *)destructor;
  destructor_local = (_func_void_void_ptr *)align;
  align_local = n;
  n_local = (size_t)this;
  bVar3 = GetSerialArenaFast(this,&local_2c0);
  if (bVar3) {
    local_218 = local_2c0;
    local_228 = destructor_local;
    ret = (char *)arena;
    local_120 = align_local;
    local_220 = align_local + 7 & 0xfffffffffffffff8;
    next = (char *)ArenaAlignAs((size_t)destructor_local);
    ptr = SerialArena::ptr(local_2c0);
    local_238 = (ThreadSafeArena *)ArenaAlign::CeilDefaultAligned<char>((ArenaAlign *)&next,ptr);
    if (local_2c0->limit_ < (char *)((long)&local_238->tag_and_id_ + local_220)) {
      local_210 = (ThreadSafeArena *)
                  SerialArena::AllocateAlignedWithCleanupFallback
                            (local_2c0,local_220,(size_t)local_228,(_func_void_void_ptr *)ret);
    }
    else {
      absl_log_internal_check_op_result = (string *)((long)&local_238->tag_and_id_ + local_220);
      SerialArena::set_ptr(local_2c0,(char *)absl_log_internal_check_op_result);
      local_1f8 = local_2c0;
      local_200 = local_238;
      local_208 = ret;
      local_100 = &local_2c0->cleanup_list_;
      local_108 = local_238;
      local_110 = ret;
      local_118 = local_2c0;
      if ((local_2c0->cleanup_list_).next_ < (local_2c0->cleanup_list_).limit_) {
        local_e0 = local_238;
        local_e8 = ret;
        local_f8 = local_238;
        local_f0 = ret;
        pCVar1 = (local_2c0->cleanup_list_).next_;
        (local_2c0->cleanup_list_).next_ = pCVar1 + 1;
        pCVar1->elem = local_238;
        pCVar1->destructor = (_func_void_void_ptr *)ret;
        local_d8 = local_100;
      }
      else {
        cleanup::ChunkList::AddFallback(local_100,local_238,(_func_void_void_ptr *)ret,local_2c0);
      }
      local_90 = local_2c0;
      local_b9 = 0;
      bVar3 = true;
      if ((local_2c0->cleanup_list_).prefetch_ptr_ != (char *)0x0) {
        bVar3 = (local_2c0->cleanup_list_).head_ <=
                (Chunk *)(local_2c0->cleanup_list_).prefetch_ptr_;
      }
      if (!bVar3) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_b8,
                   "static_cast<const void*>(cleanup_list_.prefetch_ptr_) == nullptr || static_cast<const void*>(cleanup_list_.prefetch_ptr_) >= cleanup_list_.head_"
                  );
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  (local_a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/serial_arena.h"
                   ,0x137,local_b8._M_len,local_b8._M_str);
        local_b9 = 1;
        pLVar5 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                           ((LogMessage *)local_a8);
        absl::lts_20240722::log_internal::Voidify::operator&&(&local_91,pLVar5);
      }
      if ((local_b9 & 1) != 0) {
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_a8);
      }
      local_28 = (local_2c0->cleanup_list_).next_;
      local_30 = (local_2c0->cleanup_list_).limit_;
      local_38 = (CleanupNode *)(local_2c0->cleanup_list_).prefetch_ptr_;
      local_20 = 0x180;
      if (((long)local_38 - (long)local_28 < 0x181) && (local_38 < local_30)) {
        ppcVar4 = std::max<char_const*>((char **)&local_28,(char **)&local_38);
        local_38 = (CleanupNode *)*ppcVar4;
        local_61 = 0;
        if (local_38 == (CleanupNode *)0x0) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_60,"prefetch_ptr != nullptr");
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    (local_50,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/serial_arena.h"
                     ,0x123,local_60._M_len,local_60._M_str);
          local_61 = 1;
          pLVar5 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                             ((LogMessage *)local_50);
          absl::lts_20240722::log_internal::Voidify::operator&&(&local_39,pLVar5);
        }
        if ((local_61 & 1) != 0) {
          absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_50);
        }
        local_88 = (char *)((long)&local_38->elem + local_20);
        ppcVar4 = std::min<char_const*>((char **)&local_30,&local_88);
        local_80 = (CleanupNode *)*ppcVar4;
        for (; local_38 < local_80; local_38 = local_38 + 4) {
          local_10 = local_38;
        }
      }
      (local_2c0->cleanup_list_).prefetch_ptr_ = (char *)local_38;
      local_18 = local_38;
      ppcVar4 = absl::lts_20240722::log_internal::GetReferenceableValue<char*>(&local_2c0->limit_);
      local_258 = SerialArena::ptr(local_2c0);
      v2 = absl::lts_20240722::log_internal::GetReferenceableValue<char*>(&local_258);
      local_250 = absl::lts_20240722::log_internal::Check_GEImpl<char*,char*>
                            (ppcVar4,v2,"limit_ >= ptr()");
      if (local_250 != (string *)0x0) {
        local_280 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_250);
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  (local_270,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/serial_arena.h"
                   ,0xf3,local_280._0_8_,local_280._8_8_);
        pLVar5 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                           ((LogMessage *)local_270);
        absl::lts_20240722::log_internal::Voidify::operator&&(&local_259,pLVar5);
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_270);
      }
      local_1a8 = local_2c0;
      local_1b0 = absl_log_internal_check_op_result;
      local_1d9 = 0;
      bVar3 = true;
      if (local_2c0->prefetch_ptr_ != (char *)0x0) {
        pAVar2 = (ArenaBlock *)local_2c0->prefetch_ptr_;
        pAVar6 = SerialArena::head(local_2c0);
        bVar3 = pAVar6 <= pAVar2;
      }
      if (!bVar3) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_1d8,
                   "static_cast<const void*>(prefetch_ptr_) == nullptr || static_cast<const void*>(prefetch_ptr_) >= head()"
                  );
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  (local_1c8,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/serial_arena.h"
                   ,0x12e,local_1d8._M_len,local_1d8._M_str);
        local_1d9 = 1;
        pLVar5 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                           ((LogMessage *)local_1c8);
        absl::lts_20240722::log_internal::Voidify::operator&&(&local_1b1,pLVar5);
      }
      if ((local_1d9 & 1) != 0) {
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_1c8);
      }
      local_148 = local_2c0->limit_;
      local_150 = local_2c0->prefetch_ptr_;
      local_138 = 0x400;
      local_140 = local_1b0;
      local_130 = local_150;
      if ((long)local_150 - (long)local_1b0 < 0x401) {
        if (local_150 < local_148) {
          ppcVar4 = std::max<char_const*>((char **)&local_140,&local_150);
          local_150 = *ppcVar4;
          local_179 = 0;
          if (local_150 == (char *)0x0) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_178,"prefetch_ptr != nullptr");
            absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                      (local_168,
                       "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/serial_arena.h"
                       ,0x123,local_178._M_len,local_178._M_str);
            local_179 = 1;
            pLVar5 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                               ((LogMessage *)local_168);
            absl::lts_20240722::log_internal::Voidify::operator&&(&local_151,pLVar5);
          }
          if ((local_179 & 1) != 0) {
            absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_168);
          }
          local_1a0[0] = local_150 + local_138;
          ppcVar4 = std::min<char_const*>(&local_148,local_1a0);
          for (; local_150 < *ppcVar4; local_150 = local_150 + 0x40) {
          }
        }
        local_130 = local_150;
      }
      local_2c0->prefetch_ptr_ = local_130;
      local_210 = local_238;
    }
    this_local = local_210;
  }
  else {
    this_local = (ThreadSafeArena *)
                 AllocateAlignedWithCleanupFallback
                           (this,align_local,(size_t)destructor_local,(_func_void_void_ptr *)arena);
  }
  return this_local;
}

Assistant:

void* ThreadSafeArena::AllocateAlignedWithCleanup(size_t n, size_t align,
                                                  void (*destructor)(void*)) {
  SerialArena* arena;
  if (PROTOBUF_PREDICT_TRUE(GetSerialArenaFast(&arena))) {
    return arena->AllocateAlignedWithCleanup(n, align, destructor);
  } else {
    return AllocateAlignedWithCleanupFallback(n, align, destructor);
  }
}